

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithIntLineWorks_Test::testBody
          (TEST_MemoryLeakOverridesToBeUsedInProductionCode_newDeleteOverloadsWithIntLineWorks_Test
           *this)

{
  void *mem;
  size_t sVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  size_t sVar4;
  TestTerminator *pTVar5;
  
  mem = operator_new(1,"TestFile.cpp",0x2a);
  sVar1 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->
                     super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).
                     memLeakDetector,mem_leak_period_checking);
  pUVar2 = UtestShell::getCurrent();
  pcVar3 = MemoryLeakDetector::report
                     ((this->
                      super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).
                      memLeakDetector,mem_leak_period_checking);
  (*pUVar2->_vptr_UtestShell[0xd])
            (pUVar2,"Allocated at: TestFile.cpp and line: 42.",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryOperatorOverloadTest.cpp"
             ,0x72);
  operator_delete(mem,"TestFile.cpp",0x2a);
  pUVar2 = UtestShell::getCurrent();
  sVar4 = MemoryLeakDetector::totalMemoryLeaks
                    ((this->
                     super_TEST_GROUP_CppUTestGroupMemoryLeakOverridesToBeUsedInProductionCode).
                     memLeakDetector,mem_leak_period_checking);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,sVar1 - 1,sVar4,
             "LONGS_EQUAL(memLeaks-1, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking)) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryOperatorOverloadTest.cpp"
             ,0x76,pTVar5);
  return;
}

Assistant:

TEST(MemoryLeakOverridesToBeUsedInProductionCode, newDeleteOverloadsWithIntLineWorks)
{
    const int line = 42;
    char* leak = new("TestFile.cpp", line) char;

    size_t memLeaks = memLeakDetector->totalMemoryLeaks(mem_leak_period_checking);
    STRCMP_NOCASE_CONTAINS("Allocated at: TestFile.cpp and line: 42.", memLeakDetector->report(mem_leak_period_checking));

    ::operator delete (leak, "TestFile.cpp", line);

    LONGS_EQUAL(memLeaks-1, memLeakDetector->totalMemoryLeaks(mem_leak_period_checking));
}